

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O0

int main(int narg,char **argv)

{
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  __first;
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  Covec<float> *cv_00;
  ostream *codebooks_00;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_t sVar8;
  element_type *peVar9;
  result_type_conflict1 rVar10;
  unsigned_long *puVar11;
  long lVar12;
  Config *this;
  undefined4 uVar13;
  undefined1 auVar15 [16];
  reference rVar16;
  size_t words_per_sec_1;
  rep millisec;
  time_point tack;
  size_t words_per_sec;
  double percent;
  rep millisec_1;
  time_point tack_1;
  size_t n_1;
  size_t n;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_t step;
  size_t count;
  size_t m;
  size_t epoch;
  time_point start;
  time_point tick;
  size_t every_count;
  size_t cum_count;
  Covec<float> cv;
  size_t i_3;
  size_t i_2;
  size_t counter;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  probs;
  size_t i_1;
  mt19937 gen;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  data;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  codebooks;
  int i;
  bool sort_enabled;
  bool shuffle_enabled;
  size_t order;
  vector<unsigned_long,_std::allocator<unsigned_long>_> share;
  string share_str;
  char sep;
  string output_prefix;
  string input_file;
  bool enable_chopout;
  Real eta1;
  Real eta0;
  Real sigma;
  size_t num_threads;
  size_t neg_size;
  size_t num_epochs;
  size_t batch_size;
  size_t dim;
  Config *config;
  result_type_conflict1 in_stack_ffffffffffffe3b8;
  vector<double,_std::allocator<double>_> *this_00;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__t;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe3c0;
  value_type *in_stack_ffffffffffffe3c8;
  ostream *in_stack_ffffffffffffe3d0;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  in_stack_ffffffffffffe3d8;
  undefined4 in_stack_ffffffffffffe3e0;
  undefined4 in_stack_ffffffffffffe3e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe3e8;
  unsigned_long *in_stack_ffffffffffffe3f8;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffe400;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffe408;
  reference_wrapper<covec::Covec<float>_> *in_stack_ffffffffffffe410;
  ostream *in_stack_ffffffffffffe418;
  ostream *in_stack_ffffffffffffe420;
  size_t in_stack_ffffffffffffe428;
  undefined4 in_stack_ffffffffffffe430;
  _Setw in_stack_ffffffffffffe434;
  size_t in_stack_ffffffffffffe438;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe440;
  string *in_stack_ffffffffffffe448;
  Covec<float> *in_stack_ffffffffffffe450;
  undefined4 in_stack_ffffffffffffe460;
  undefined4 in_stack_ffffffffffffe464;
  ulong local_1b30;
  undefined8 in_stack_ffffffffffffe658;
  char sep_00;
  string *in_stack_ffffffffffffe660;
  duration<long,_std::ratio<1L,_1000L>_> local_1850;
  ulong local_1848;
  undefined8 local_1840;
  unsigned_long local_1838;
  int local_1830;
  int local_182c;
  int local_1828;
  int local_1824;
  ulong local_1820;
  double local_1818;
  rep local_1810;
  duration<long,_std::ratio<1L,_1000L>_> local_1808;
  ulong local_1800;
  undefined8 local_17f8;
  size_type local_17f0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_17e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_17b8;
  Covec<float> *local_17b0;
  unsigned_long in_stack_ffffffffffffe858;
  undefined2 uVar17;
  size_t in_stack_ffffffffffffe860;
  string *in_stack_ffffffffffffe868;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_ffffffffffffe870;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  *in_stack_ffffffffffffe878;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffe890;
  size_type local_1748;
  vector<std::thread,_std::allocator<std::thread>_> local_1738;
  ulong local_1720;
  size_type local_1718;
  unsigned_long local_1710;
  ulong local_1708;
  ulong local_1700;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_16f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_16f0;
  ulong local_16e8;
  unsigned_long local_16e0;
  unsigned_long local_16d8;
  unsigned_long local_16d0;
  unsigned_long local_16c8;
  double *local_1610;
  double *local_1608;
  reference local_15f0;
  ulong local_15e0;
  ulong local_15d8;
  value_type local_15d0;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  local_15a0;
  ulong local_1588;
  char **in_stack_fffffffffffff180;
  int in_stack_fffffffffffff18c;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1f8;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  local_1e0;
  int local_1c4;
  string local_1c0 [38];
  byte local_19a;
  byte local_199;
  size_t local_198;
  undefined1 local_190 [63];
  char local_151;
  string local_150 [48];
  string local_120 [35];
  byte local_fd;
  float local_fc;
  float local_f8;
  float local_f4;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined1 local_c8 [8];
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  float local_98;
  float local_94;
  float local_90;
  byte local_8c;
  string asStack_88 [112];
  undefined1 *local_18;
  int local_4;
  undefined1 auVar14 [16];
  
  sep_00 = (char)((ulong)in_stack_ffffffffffffe658 >> 0x38);
  local_4 = 0;
  anon_unknown.dwarf_228aa::parse_args(in_stack_fffffffffffff18c,in_stack_fffffffffffff180);
  local_d0 = local_c0;
  local_d8 = local_b8;
  local_e0 = local_b0;
  local_e8 = local_a8;
  local_f0 = local_a0;
  local_f4 = local_98;
  local_f8 = local_94;
  local_fc = local_90;
  local_fd = local_8c & 1;
  local_18 = local_c8;
  std::__cxx11::string::string(local_120,asStack_88);
  std::__cxx11::string::string(local_150,(string *)(local_18 + 0x60));
  local_151 = local_18[0x80];
  std::__cxx11::string::string((string *)(local_190 + 0x18),(string *)(local_18 + 0x88));
  anon_unknown.dwarf_228aa::parse_share_str(in_stack_ffffffffffffe448);
  local_198 = anon_unknown.dwarf_228aa::detect_order(in_stack_ffffffffffffe660,sep_00);
  local_199 = local_18[0xa8] & 1;
  local_19a = local_18[0xa9] & 1;
  poVar3 = std::operator<<((ostream *)&std::cout,"config:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"dim          : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"batch_size   : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_d8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"num_epochs   : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"neg_size     : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"num_threads  : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f0);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"sigma        : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"  ");
  poVar3 = std::operator<<(poVar3,"eta0         : ");
  cv_00 = (Covec<float> *)std::ostream::operator<<(poVar3,local_f8);
  std::ostream::operator<<((ostream *)cv_00,std::endl<char,std::char_traits<char>>);
  codebooks_00 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(codebooks_00,"eta1         : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_fc);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"input_file   : ");
  poVar4 = std::operator<<(poVar4,local_120);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"output_vector_file  : ");
  std::operator+(in_stack_ffffffffffffe3e8,
                 (char *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  poVar4 = std::operator<<(poVar4,local_1c0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c0);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"sep          : ");
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,local_151);
  poVar4 = std::operator<<(poVar4,"\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  std::operator<<(poVar4,"share        : ");
  local_1c4 = 0;
  while( true ) {
    uVar5 = (ulong)local_1c4;
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
    uVar17 = (undefined2)(in_stack_ffffffffffffe858 >> 0x30);
    if (sVar6 <= uVar5) break;
    if (0 < local_1c4) {
      std::operator<<((ostream *)&std::cout,",");
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,
                        (long)local_1c4);
    std::ostream::operator<<((ostream *)&std::cout,*pvVar7);
    local_1c4 = local_1c4 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"order        : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_198);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"shuffle      : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::boolalpha);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_199 & 1));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"  ");
  poVar4 = std::operator<<(poVar4,"sort         : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::boolalpha);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_19a & 1));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  ::vector((vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            *)0x138155);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x138162);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffe3c0,in_stack_ffffffffffffe3b8);
  poVar4 = std::operator<<((ostream *)&std::cout,"load ");
  poVar4 = std::operator<<(poVar4,local_120);
  poVar4 = std::operator<<(poVar4," ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  this_00 = (vector<double,_std::allocator<double>_> *)local_190;
  anon_unknown.dwarf_228aa::load
            (in_stack_ffffffffffffe878,in_stack_ffffffffffffe870,in_stack_ffffffffffffe868,
             in_stack_ffffffffffffe860,(char)((ushort)uVar17 >> 8),SUB21(uVar17,0),
             in_stack_ffffffffffffe890);
  poVar4 = std::operator<<((ostream *)&std::cout,"data size: ");
  sVar6 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size(&local_1f8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"codebook sizes:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_1588 = 0; local_1588 < local_198; local_1588 = local_1588 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1588);
    poVar4 = std::operator<<(poVar4,": ");
    std::
    vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
    ::operator[](&local_1e0,local_1588);
    std::
    __shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x138356);
    sVar8 = anon_unknown.dwarf_228aa::CodeBook::size((CodeBook *)0x13835e);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"creat distributions ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ::vector((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
            *)0x138411);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x13841e);
  local_15d0 = 0;
  local_15d8 = 0;
  do {
    uVar5 = local_15d8;
    sVar6 = std::
            vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ::size(&local_1e0);
    if (sVar6 <= uVar5) {
      local_15e0 = 0;
      while( true ) {
        uVar5 = local_15e0;
        sVar6 = std::
                vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                ::size(&local_1e0);
        if (sVar6 <= uVar5) break;
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                            (size_type)in_stack_ffffffffffffe3d8._M_current);
        local_15f0 = rVar16;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_15f0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::
          vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ::operator[](&local_1e0,local_15e0);
          peVar9 = std::
                   __shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x138605);
          anon_unknown.dwarf_228aa::CodeBook::counts(peVar9);
          local_1608 = (double *)std::vector<double,_std::allocator<double>_>::begin(this_00);
          std::
          vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ::operator[](&local_1e0,local_15e0);
          peVar9 = std::
                   __shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x138649);
          anon_unknown.dwarf_228aa::CodeBook::counts(peVar9);
          local_1610 = (double *)std::vector<double,_std::allocator<double>_>::end(this_00);
          std::
          make_shared<std::discrete_distribution<int>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)in_stack_ffffffffffffe3e8,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
          std::
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ::push_back((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                       *)in_stack_ffffffffffffe3c0,(value_type *)this_00);
          std::shared_ptr<std::discrete_distribution<int>_>::~shared_ptr
                    ((shared_ptr<std::discrete_distribution<int>_> *)0x1386b3);
        }
        else {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,
                              local_15e0);
          std::
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ::operator[](&local_15a0,*pvVar7);
          std::
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ::push_back((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                       *)in_stack_ffffffffffffe3d0,in_stack_ffffffffffffe3c8);
        }
        local_15e0 = local_15e0 + 1;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"initialize covec ...");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __t = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)local_190;
      covec::Covec<float>::
      Covec<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                (in_stack_ffffffffffffe450,
                 (vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                  *)in_stack_ffffffffffffe448,in_stack_ffffffffffffe440,in_stack_ffffffffffffe438,
                 (float)in_stack_ffffffffffffe434._M_n,in_stack_ffffffffffffe428,
                 (float)((ulong)in_stack_ffffffffffffe420 >> 0x20),
                 SUB84(in_stack_ffffffffffffe420,0),
                 SUB81((ulong)in_stack_ffffffffffffe418 >> 0x38,0),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffe464,in_stack_ffffffffffffe460));
      poVar4 = std::operator<<((ostream *)&std::cout,"start training ...");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_16c8 = 0;
      local_16d0 = 1000000;
      local_16e0 = std::chrono::_V2::system_clock::now();
      local_16d8 = local_16e0;
      for (local_16e8 = 0; local_16e8 < local_e0; local_16e8 = local_16e8 + 1) {
        rVar10 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()(in_stack_ffffffffffffe3c0);
        srand((uint)rVar10);
        if ((local_199 & 1) != 0) {
          local_16f0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::begin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                *)__t);
          local_16f8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::end((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)__t);
          __first._M_current._4_4_ = in_stack_ffffffffffffe3e4;
          __first._M_current._0_4_ = in_stack_ffffffffffffe3e0;
          std::
          random_shuffle<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                    (__first,in_stack_ffffffffffffe3d8);
        }
        local_1700 = 0;
        while( true ) {
          uVar5 = local_1700;
          sVar6 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size(&local_1f8);
          if (sVar6 <= uVar5) break;
          local_1710 = local_1700 + local_16d0;
          local_1718 = std::
                       vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ::size(&local_1f8);
          puVar11 = std::min<unsigned_long>(&local_1710,&local_1718);
          local_1708 = *puVar11 - local_1700;
          local_1720 = local_1708 / local_f0;
          std::allocator<std::thread>::allocator((allocator<std::thread> *)0x138998);
          std::vector<std::thread,_std::allocator<std::thread>_>::vector
                    ((vector<std::thread,_std::allocator<std::thread>_> *)
                     CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                     (size_type)in_stack_ffffffffffffe3d8._M_current,
                     (allocator_type *)in_stack_ffffffffffffe3d0);
          std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1389c4);
          for (local_1748 = 0; local_1748 < local_f0; local_1748 = local_1748 + 1) {
            if (local_1748 + 1 < local_f0) {
              std::ref<covec::Covec<float>>((Covec<float> *)__t);
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::cbegin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)__t);
              __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_ffffffffffffe3c8,(difference_type)in_stack_ffffffffffffe3c0);
              __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_ffffffffffffe3c8,(difference_type)in_stack_ffffffffffffe3c0);
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::cbegin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        *)__t);
              __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_ffffffffffffe3c8,(difference_type)in_stack_ffffffffffffe3c0);
              __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_ffffffffffffe3c8,(difference_type)in_stack_ffffffffffffe3c0);
              std::
              ref<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (__t);
              __t = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)&stack0xffffffffffffe868;
              std::thread::
              thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                        ((thread *)in_stack_ffffffffffffe420,
                         (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                          **)in_stack_ffffffffffffe418,in_stack_ffffffffffffe410,
                         in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,
                         in_stack_ffffffffffffe3f8,
                         (reference_wrapper<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                          *)CONCAT44(in_stack_ffffffffffffe434._M_n,in_stack_ffffffffffffe430));
              std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                        (&local_1738,local_1748);
              std::thread::operator=((thread *)in_stack_ffffffffffffe3c0,(thread *)__t);
              std::thread::~thread((thread *)0x138b71);
            }
            else {
              local_17b0 = (Covec<float> *)std::ref<covec::Covec<float>>((Covec<float> *)__t);
              local_17c8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           std::
                           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ::cbegin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)__t);
              local_17c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           __gnu_cxx::
                           __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                        *)in_stack_ffffffffffffe3c8,
                                       (difference_type)in_stack_ffffffffffffe3c0);
              local_17b8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           __gnu_cxx::
                           __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                        *)in_stack_ffffffffffffe3c8,
                                       (difference_type)in_stack_ffffffffffffe3c0);
              local_17e0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           std::
                           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ::cbegin((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     *)__t);
              local_17d8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           __gnu_cxx::
                           __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                        *)in_stack_ffffffffffffe3c8,
                                       (difference_type)in_stack_ffffffffffffe3c0);
              local_17d0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           __gnu_cxx::
                           __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           ::operator+((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                        *)in_stack_ffffffffffffe3c8,
                                       (difference_type)in_stack_ffffffffffffe3c0);
              local_17e8 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)std::
                              ref<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                        (__t);
              __t = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)&local_17e8;
              std::thread::
              thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                        ((thread *)in_stack_ffffffffffffe420,
                         (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                          **)in_stack_ffffffffffffe418,in_stack_ffffffffffffe410,
                         in_stack_ffffffffffffe408,in_stack_ffffffffffffe400,
                         in_stack_ffffffffffffe3f8,
                         (reference_wrapper<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
                          *)CONCAT44(in_stack_ffffffffffffe434._M_n,in_stack_ffffffffffffe430));
              std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                        (&local_1738,local_1748);
              std::thread::operator=((thread *)in_stack_ffffffffffffe3c0,(thread *)__t);
              std::thread::~thread((thread *)0x138d24);
            }
          }
          for (local_17f0 = 0; local_17f0 < local_f0; local_17f0 = local_17f0 + 1) {
            std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
                      (&local_1738,local_17f0);
            std::thread::join();
          }
          local_16c8 = local_16c8 + local_1708;
          local_17f8 = std::chrono::_V2::system_clock::now();
          local_1810 = (rep)std::chrono::operator-
                                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)in_stack_ffffffffffffe3c8,
                                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)in_stack_ffffffffffffe3c0);
          local_1808.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                              ((duration<long,_std::ratio<1L,_1000000000L>_> *)__t);
          local_1800 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1808);
          auVar14._8_4_ = (int)(local_16c8 >> 0x20);
          auVar14._0_8_ = local_16c8;
          auVar14._12_4_ = 0x45300000;
          uVar13 = (undefined4)local_16c8;
          sVar6 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::size(&local_1f8);
          lVar12 = sVar6 * local_e0;
          auVar15._8_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar15._0_8_ = lVar12;
          auVar15._12_4_ = 0x45300000;
          local_1818 = (((auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar13) - 4503599627370496.0)) * 100.0) /
                       ((auVar15._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
          if (0 < (long)local_1800) {
            if (local_1800 == 0) {
              local_1b30 = std::numeric_limits<unsigned_long>::max();
            }
            else {
              local_1b30 = (local_1708 * 1000) / local_1800;
            }
            local_1820 = local_1b30;
            poVar4 = std::operator<<((ostream *)&std::cout,"\r");
            poVar4 = std::operator<<(poVar4,"epoch ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
            local_1824 = (int)std::setw(3);
            poVar4 = std::operator<<(poVar4,(_Setw)local_1824);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_16e8 + 1);
            poVar4 = std::operator<<(poVar4,"/");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_e0);
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
            local_1828 = (int)std::setw(5);
            poVar4 = std::operator<<(poVar4,(_Setw)local_1828);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::fixed);
            local_182c = (int)std::setprecision(2);
            poVar4 = std::operator<<(poVar4,(_Setprecision)local_182c);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1818);
            poVar4 = std::operator<<(poVar4," %");
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
            in_stack_ffffffffffffe434 = std::setw(6);
            local_1830 = in_stack_ffffffffffffe434._M_n;
            poVar4 = std::operator<<(poVar4,in_stack_ffffffffffffe434);
            in_stack_ffffffffffffe420 = (ostream *)std::ostream::operator<<(poVar4,local_1820);
            in_stack_ffffffffffffe418 = std::operator<<(in_stack_ffffffffffffe420," words/sec.");
            std::ostream::operator<<
                      (in_stack_ffffffffffffe418,std::flush<char,std::char_traits<char>>);
            local_1838 = std::chrono::_V2::system_clock::now();
            local_16d8 = local_1838;
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                    ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffe3d0)
          ;
          local_1700 = local_16d0 + local_1700;
        }
      }
      local_1840 = std::chrono::_V2::system_clock::now();
      std::chrono::operator-
                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffe3c8,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)in_stack_ffffffffffffe3c0);
      local_1850.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)__t);
      local_1848 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_1850);
      if (0 < (long)local_1848) {
        sVar6 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::size(&local_1f8);
        uVar5 = (sVar6 * local_e0 * 1000) / local_1848;
        poVar4 = std::operator<<((ostream *)&std::cout,"\r");
        poVar4 = std::operator<<(poVar4,"average: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
        _Var2 = std::setw(6);
        poVar4 = std::operator<<(poVar4,_Var2);
        in_stack_ffffffffffffe3d0 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
        poVar4 = std::operator<<(in_stack_ffffffffffffe3d0," words/sec.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      this = (Config *)std::operator<<((ostream *)&std::cout,"save ...");
      std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
      anon_unknown.dwarf_228aa::save
                ((string *)poVar3,cv_00,
                 (vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  *)codebooks_00);
      local_4 = 0;
      covec::Covec<float>::~Covec((Covec<float> *)this);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x139463);
      std::
      vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
      ::~vector((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                 *)in_stack_ffffffffffffe3d0);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_ffffffffffffe3d0);
      std::
      vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
      ::~vector((vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                 *)in_stack_ffffffffffffe3d0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffe3d0)
      ;
      std::__cxx11::string::~string((string *)(local_190 + 0x18));
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_120);
      anon_unknown.dwarf_228aa::Config::~Config(this);
      return local_4;
    }
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffe3d0);
    if (bVar1) {
LAB_0013849a:
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffe420,
                 SUB81((ulong)in_stack_ffffffffffffe418 >> 0x38,0));
      local_15d0 = local_15d0 + 1;
    }
    else {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,
                          local_15d8);
      if (*pvVar7 == local_15d0) goto LAB_0013849a;
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffe420,
                 SUB81((ulong)in_stack_ffffffffffffe418 >> 0x38,0));
    }
    local_15d8 = local_15d8 + 1;
  } while( true );
}

Assistant:

int main(int narg, const char** argv)
{
  const auto& config = parse_args(narg, argv);

  const std::size_t dim = config.dim;
  const std::size_t batch_size = config.batch_size;
  const std::size_t num_epochs = config.num_epochs;
  const std::size_t neg_size = config.neg_size;
  const std::size_t num_threads = config.num_threads;
  const Real sigma = config.sigma;
  const Real eta0 = config.eta0;
  const Real eta1 = config.eta1;
  const bool enable_chopout = config.enable_chopout;
  const std::string input_file = config.input_file;
  const std::string output_prefix = config.output_prefix;
  const char sep = config.sep;
  const std::string share_str = config.share_str;
  const std::vector<std::size_t> share = parse_share_str(share_str);
  const std::size_t order = detect_order(input_file, sep);
  const bool shuffle_enabled = config.shuffle_enabled;
  const bool sort_enabled = config.sort_enabled;

  std::cout << "config:" << std::endl;
  std::cout << "  " <<  "dim          : " << dim << std::endl;
  std::cout << "  " <<  "batch_size   : " << batch_size << std::endl;
  std::cout << "  " <<  "num_epochs   : " << num_epochs << std::endl;
  std::cout << "  " <<  "neg_size     : " << neg_size << std::endl;
  std::cout << "  " <<  "num_threads  : " << num_threads << std::endl;  
  std::cout << "  " <<  "sigma        : " << sigma << std::endl;
  std::cout << "  " <<  "eta0         : " << eta0 << std::endl;
  std::cout << "  " <<  "eta1         : " << eta1 << std::endl;
  std::cout << "  " <<  "input_file   : " << input_file << std::endl;
  std::cout << "  " <<  "output_vector_file  : " << output_prefix + ".<#>.tsv" << std::endl;
  std::cout << "  " <<  "sep          : " << "\"" << sep << "\"" << std::endl;
  
  std::cout << "  " <<  "share        : ";
  for(int i = 0; i < share.size(); ++i){
    if(i > 0){
      std::cout << ",";
    }
    std::cout << share[i];
  }
  std::cout << std::endl;
  
  std::cout << "  " <<  "order        : " << order << std::endl;
  std::cout << "  " <<  "shuffle      : " << std::boolalpha << shuffle_enabled << std::endl;
  std::cout << "  " <<  "sort         : " << std::boolalpha << sort_enabled << std::endl;

  std::vector<std::shared_ptr<CodeBook> > codebooks;
  std::vector<std::vector<std::size_t> > data;
  std::mt19937 gen(0);
  std::cout << "load " << input_file << " ..." << std::endl;;
  load(codebooks, data, input_file, order, sep, sort_enabled, share);
  std::cout << "data size: " << data.size() << std::endl;
  std::cout << "codebook sizes:" << std::endl;
  for(std::size_t i=0; i<order; ++i){
    std::cout << "  " << i << ": " << codebooks[i]->size() << std::endl;
  }

  std::cout << "creat distributions ..." << std::endl;
  std::vector<std::shared_ptr<std::discrete_distribution<int> > > probs;

  std::vector<bool> first_of_sharings;
  std::size_t counter=0;
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(share.empty() || share[i] == counter){
      first_of_sharings.push_back(true);
      ++counter;      
    }else{
      first_of_sharings.push_back(false);
    }
  }
  
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(!first_of_sharings[i]){
      probs.push_back(probs[share[i]]);
    }else{
      probs.push_back( std::make_shared<std::discrete_distribution<int> >
                       (codebooks[i]->counts().begin(), codebooks[i]->counts().end())
                       );
    }
  }
  
  std::cout << "initialize covec ..." << std::endl;
  Covec<Real> cv(probs, gen, dim, sigma, neg_size, eta0, eta1, enable_chopout, share);

  std::cout << "start training ..." << std::endl;
  std::size_t cum_count = 0, every_count = 1000000;
  auto tick = std::chrono::system_clock::now();
  auto start = tick;
  for(std::size_t epoch=0; epoch<num_epochs; ++epoch){
    std::srand(gen());
    if(shuffle_enabled){ std::random_shuffle(data.begin(), data.end()); }

    for(std::size_t m = 0; m < data.size(); m += every_count){

      std::size_t count = std::min(m + every_count, data.size()) - m; // the number of data in this round
      
      std::size_t step = count / num_threads; // data / thread

      // multi thread update
      std::vector<std::thread> threads(num_threads);
      for(std::size_t n=0; n < num_threads; ++n){
        if(n + 1 < num_threads){
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + (n+1) * step,
                                   batch_size,
                                   std::ref(gen));
          assert( m + (n+1) * step <= data.size() );
        }else{
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + count,
                                   batch_size,
                                   std::ref(gen));
          assert( std::min(m + every_count, data.size()) <= data.size() );	  
        }
      }
      for(std::size_t n=0; n < num_threads; ++n){
        threads[n].join();
      }
      
      cum_count += count;
      
      // report
      auto tack = std::chrono::system_clock::now();
      auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - tick).count();
      double percent = (cum_count * 100.0) / (data.size() * num_epochs);
      if(millisec>0){
        std::size_t words_per_sec = (millisec != 0)? (1000*count) / millisec : std::numeric_limits<std::size_t>::max();
        std::cout << "\r"
                  << "epoch " << std::right << std::setw(3) << epoch+1 << "/" << num_epochs
                  << "  " << std::left << std::setw(5) << std::fixed << std::setprecision(2) << percent << " %"
                  << "  " << std::left << std::setw(6) << words_per_sec << " words/sec."
                  << std::flush;
        tick = std::chrono::system_clock::now();
      }
    }
  }

  auto tack = std::chrono::system_clock::now();
  auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - start).count();
  if(millisec > 0){
    std::size_t words_per_sec = (1000 * data.size() * num_epochs) / millisec;
    std::cout << "\r" << "average: " 
              << std::left << std::setw(6)
              << words_per_sec << " words/sec." << std::endl;
  }
  std::cout << std::endl;
  std::cout << "save ..." << std::endl;
  save(output_prefix, cv, codebooks);

  return 0;
}